

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dcm-bias-estimation.cpp
# Opt level: O3

int testDcmBiasEstimator(int errorCode)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  double *pdVar7;
  double *pdVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Scalar SVar19;
  undefined1 (*pauVar20) [16];
  double *pdVar21;
  double *pdVar22;
  double *pdVar23;
  _Elt_pointer pMVar24;
  _Elt_pointer pMVar25;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar26;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar27;
  ostream *poVar28;
  undefined8 *puVar29;
  Index index;
  char *pcVar30;
  Matrix<double,__1,_1,_0,__1,_1> *other;
  _Elt_pointer pMVar31;
  ulong uVar32;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar33;
  ulong uVar34;
  DenseStorage<double,__1,__1,_1,_0> *pDVar35;
  long lVar36;
  long lVar37;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pDVar38;
  long lVar39;
  _Elt_pointer pMVar40;
  ulong uVar41;
  undefined4 uVar42;
  double dVar43;
  undefined4 uVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  Scalar SVar48;
  double dVar51;
  double dVar52;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  IndexedVectorArray dcm;
  IndexedVectorArray localBias;
  IndexedVectorArray dcm_hat;
  Vector log_k;
  IndexedVectorArray gamma;
  IndexedVectorArray zmp;
  IndexedVectorArray dcm_m_unbiased;
  IndexedVectorArray zmp_m;
  IndexedVectorArray bias_hat;
  IndexedVectorArray dcm_m;
  IndexedVectorArray bias;
  vector<double,_std::allocator<double>_> kappa;
  vector<double,_std::allocator<double>_> yaw;
  IndexedVectorArray log;
  LipmDcmEstimator est;
  double local_bb8;
  double dStack_bb0;
  double dStack_ba0;
  int local_b94;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_b88;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_b38;
  long local_b08;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_b00;
  long local_ab0;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_aa8;
  undefined1 local_a58 [8];
  double dStack_a50;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_a48;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_a40;
  long local_a38;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_a30;
  long local_9e0;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_9d8;
  Rotation2D<double> local_988;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  dStack_980;
  long local_930;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_928;
  double local_8d8;
  _Elt_pointer pMStack_8d0;
  double local_8c8;
  double dStack_8c0;
  long local_8b0;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_8a8;
  long local_858;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_850;
  long local_800;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_7f8;
  double local_7a8;
  double dStack_7a0;
  double local_798;
  double dStack_790;
  double local_788;
  undefined8 uStack_780;
  Rotation2D<double> local_778;
  double dStack_770;
  vector<double,_std::allocator<double>_> local_768;
  vector<double,_std::allocator<double>_> local_750;
  Rotation2D<double> local_738;
  undefined8 uStack_730;
  double local_728;
  double dStack_720;
  double dStack_718;
  double dStack_710;
  double local_708;
  double dStack_700;
  double dStack_6f8;
  double dStack_6f0;
  double local_6e8;
  double dStack_6e0;
  double dStack_6d8;
  double dStack_6d0;
  double local_6c8;
  double dStack_6c0;
  double dStack_6b8;
  double dStack_6b0;
  double local_6a8;
  double dStack_6a0;
  double dStack_698;
  double dStack_690;
  double local_688;
  double dStack_680;
  double dStack_678;
  double dStack_670;
  double local_668;
  double dStack_660;
  double dStack_658;
  double dStack_650;
  double local_648;
  double dStack_640;
  double dStack_638;
  double dStack_630;
  double local_628;
  double dStack_620;
  double dStack_618;
  double dStack_610;
  double local_608;
  _Elt_pointer pMStack_600;
  undefined1 local_5f8 [16];
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined1 local_5d8 [16];
  double local_5c8;
  double dStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  Matrix2 local_578 [42];
  
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::deque(&local_b88,24000,(allocator_type *)local_578);
  local_b08 = 0;
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::deque(&local_b00,24000,(allocator_type *)local_578);
  local_800 = 0;
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::deque(&local_7f8,24000,(allocator_type *)local_578);
  local_9e0 = 0;
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::deque(&local_9d8,24000,(allocator_type *)local_578);
  local_a38 = 0;
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::deque(&local_a30,24000,(allocator_type *)local_578);
  std::vector<double,_std::allocator<double>_>::vector(&local_750,24000,(allocator_type *)local_578)
  ;
  std::vector<double,_std::allocator<double>_>::vector(&local_768,24000,(allocator_type *)local_578)
  ;
  local_628 = 1.0;
  dStack_620 = 0.0;
  dStack_618 = 0.0;
  dStack_610 = 1.0;
  local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
  [0] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
  local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
  [1] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
  local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
  [2] = (double)&local_628;
  lVar36 = ((long)local_b88.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_b88.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
           ((long)local_b88.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_b88.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)local_b88.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_b88.
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_b88.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20;
  if ((lVar36 == 0) || (lVar36 < 1)) goto LAB_0010736e;
  uVar34 = (long)local_b88.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur -
           (long)local_b88.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first >> 4;
  if ((long)uVar34 < 0) {
    uVar41 = (long)local_b88.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur -
             (long)local_b88.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 9;
LAB_00104134:
    pMVar24 = local_b88.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20;
  }
  else {
    pMVar24 = local_b88.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (0x1f < uVar34) {
      uVar41 = uVar34 >> 5;
      goto LAB_00104134;
    }
  }
  dVar45 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
           m_data.array[0] * local_628;
  dVar51 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
           m_data.array[0] * dStack_620;
  dVar46 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
           m_data.array[1] * dStack_618;
  dStack_ba0 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
               m_data.array[1] * dStack_610;
  pauVar20 = (undefined1 (*) [16])
             (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
  if ((pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      2) {
    auVar50._8_4_ = SUB84(dStack_ba0,0);
    auVar50._0_8_ = dVar46;
    auVar50._12_4_ = (int)((ulong)dStack_ba0 >> 0x20);
    free(pauVar20);
    pauVar20 = (undefined1 (*) [16])malloc(0x10);
    if (((ulong)pauVar20 & 0xf) != 0) goto LAB_0010738d;
    if (pauVar20 == (undefined1 (*) [16])0x0) {
      puVar29 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar29 = std::ios::widen;
      __cxa_throw(puVar29,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         (double *)pauVar20;
    (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 2;
    dStack_ba0 = auVar50._8_8_;
  }
  dVar51 = (dVar51 + dStack_ba0 + 0.0) * 4.0;
  auVar9._8_4_ = SUB84(dVar51,0);
  auVar9._0_8_ = (dVar45 + dVar46 + 0.0) * 4.0;
  auVar9._12_4_ = (int)((ulong)dVar51 >> 0x20);
  *pauVar20 = auVar9;
  local_648 = 1.0;
  dStack_640 = 0.0;
  dStack_638 = 0.0;
  dStack_630 = 1.0;
  local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
  [0] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
  local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
  [1] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
  local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
  [2] = (double)&local_648;
  lVar36 = ((long)local_b00.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_b00.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
           ((long)local_b00.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_b00.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)local_b00.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_b00.
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_b00.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20;
  if (((lVar36 == 0) || (0 < local_b08)) || (lVar36 + local_b08 < 1)) goto LAB_0010736e;
  uVar34 = ((long)local_b00.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
            (long)local_b00.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - local_b08;
  if ((long)uVar34 < 0) {
    uVar41 = (long)uVar34 >> 5;
LAB_001042ee:
    pMVar24 = local_b00.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20;
  }
  else {
    if (0x1f < uVar34) {
      uVar41 = uVar34 >> 5;
      goto LAB_001042ee;
    }
    pMVar24 = local_b00.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur + -local_b08;
  }
  dVar45 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
           m_data.array[0] * local_648;
  dVar51 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
           m_data.array[0] * dStack_640;
  dVar46 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
           m_data.array[1] * dStack_638;
  dStack_ba0 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
               m_data.array[1] * dStack_630;
  pauVar20 = (undefined1 (*) [16])
             (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
  if ((pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      2) {
    auVar10._8_4_ = SUB84(dStack_ba0,0);
    auVar10._0_8_ = dVar46;
    auVar10._12_4_ = (int)((ulong)dStack_ba0 >> 0x20);
    free(pauVar20);
    pauVar20 = (undefined1 (*) [16])malloc(0x10);
    if (((ulong)pauVar20 & 0xf) != 0) goto LAB_0010738d;
    if (pauVar20 == (undefined1 (*) [16])0x0) {
      puVar29 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar29 = std::ios::widen;
      __cxa_throw(puVar29,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         (double *)pauVar20;
    (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 2;
    dStack_ba0 = auVar10._8_8_;
  }
  dVar51 = (dVar51 + dStack_ba0 + 0.0) * 0.01;
  auVar11._8_4_ = SUB84(dVar51,0);
  auVar11._0_8_ = (dVar45 + dVar46 + 0.0) * 0.01;
  auVar11._12_4_ = (int)((ulong)dVar51 >> 0x20);
  *pauVar20 = auVar11;
  local_668 = 1.0;
  dStack_660 = 0.0;
  dStack_658 = 0.0;
  dStack_650 = 1.0;
  local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
  [0] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
  pMVar24 = (_Elt_pointer)
            stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
  local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
  [2] = (double)&local_668;
  lVar36 = ((long)local_b88.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_b88.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
           ((long)local_b88.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_b88.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)local_b88.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_b88.
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_b88.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20;
  local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
  [1] = (double)pMVar24;
  if ((lVar36 == 0) || (lVar36 < 1)) goto LAB_0010736e;
  uVar34 = (long)local_b88.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur -
           (long)local_b88.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first >> 4;
  if ((long)uVar34 < 0) {
    uVar41 = (long)local_b88.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur -
             (long)local_b88.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 9;
LAB_00104481:
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [1] = (double)(local_b88.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] +
                  uVar34 + uVar41 * -0x20);
  }
  else {
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [1] = (double)local_b88.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (0x1f < uVar34) {
      uVar41 = uVar34 >> 5;
      goto LAB_00104481;
    }
  }
  lVar36 = (((_Elt_pointer)
            local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
            m_data.array[1])->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
           m_storage.m_rows;
  if (lVar36 < 0) {
LAB_001073ac:
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [1] = (double)pMVar24;
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                 );
  }
  dVar51 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
           m_data.array[0] * local_668;
  dVar53 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
           m_data.array[0] * dStack_660;
  dVar46 = (double)pMVar24 * dStack_658;
  dVar45 = (double)pMVar24 * dStack_650;
  local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
  [0] = 1.6060915267313265;
  if (lVar36 != 2) {
    pcVar30 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, 2, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, 2, 1>]"
    ;
LAB_001074a9:
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar30);
  }
  lVar36 = ((long)local_9d8.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_9d8.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
           ((long)local_9d8.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_9d8.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)local_9d8.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_9d8.
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_9d8.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20;
  if (((lVar36 == 0) || (0 < local_9e0)) || (lVar36 + local_9e0 < 1)) goto LAB_0010736e;
  uVar34 = ((long)local_9d8.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
            (long)local_9d8.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - local_9e0;
  if ((long)uVar34 < 0) {
    uVar41 = (long)uVar34 >> 5;
LAB_001045a3:
    pMVar24 = local_9d8.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20;
  }
  else {
    if (0x1f < uVar34) {
      uVar41 = uVar34 >> 5;
      goto LAB_001045a3;
    }
    pMVar24 = local_9d8.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur + -local_9e0;
  }
  local_8d8 = 1.6060915267313265;
  pdVar22 = (((_Elt_pointer)
             local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[1])->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
            m_storage.m_data;
  pdVar21 = (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_data;
  if ((pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      2) {
    local_8d8 = 1.6060915267313265;
    pMStack_8d0 = (_Elt_pointer)
                  local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                  m_storage.m_data.array[1];
    free(pdVar21);
    pdVar21 = (double *)malloc(0x10);
    if (((ulong)pdVar21 & 0xf) != 0) {
LAB_0010738d:
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pdVar21 == (double *)0x0) {
      puVar29 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar29 = std::ios::widen;
      __cxa_throw(puVar29,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         pdVar21;
    (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 2;
  }
  dVar51 = (dVar51 + dVar46 + 0.0) * 0.05;
  dVar53 = (dVar53 + dVar45 + 0.0) * 0.05;
  dVar45 = local_8d8 * *pdVar22 + dVar51;
  pMStack_8d0 = (_Elt_pointer)(local_8d8 * pdVar22[1] + dVar53);
  *pdVar21 = dVar45;
  pdVar21[1] = (double)pMStack_8d0;
  dVar46 = 0.0;
  do {
    local_688 = 1.0;
    dStack_680 = 0.0;
    dStack_678 = 0.0;
    dStack_670 = 1.0;
    local_8d8 = dVar45;
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [0] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [1] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [2] = (double)&local_688;
    lVar36 = ((long)local_a30.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_a30.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
             ((long)local_a30.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_a30.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)local_a30.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_a30.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_a30.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20
    ;
    if (((lVar36 == 0) || ((long)dVar46 < local_a38)) || (local_a38 + lVar36 <= (long)dVar46))
    goto LAB_0010736e;
    uVar34 = ((long)local_a30.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_a30.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
             ((long)dVar46 - local_a38);
    if ((long)uVar34 < 0) {
      uVar41 = (long)uVar34 >> 5;
LAB_0010477c:
      pMVar24 = local_a30.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20;
    }
    else {
      if (0x1f < uVar34) {
        uVar41 = uVar34 >> 5;
        goto LAB_0010477c;
      }
      pMVar24 = local_a30.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur + ((long)dVar46 - local_a38);
    }
    dVar47 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[0] * local_688;
    dVar52 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[0] * dStack_680;
    pdVar22 = (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    dVar45 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[1] * dStack_678;
    dVar43 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[1] * dStack_670;
    if ((pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        != 2) {
      local_798 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                  m_storage.m_data.array[1] * dStack_678;
      dStack_790 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                   m_storage.m_data.array[1] * dStack_670;
      free(pdVar22);
      pdVar22 = (double *)malloc(0x10);
      if (((ulong)pdVar22 & 0xf) != 0) goto LAB_0010738d;
      if (pdVar22 == (double *)0x0) {
        puVar29 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar29 = std::ios::widen;
        __cxa_throw(puVar29,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           pdVar22;
      (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 2
      ;
      dVar45 = local_798;
      dVar43 = dStack_790;
    }
    *pdVar22 = dVar47 + dVar45 + 0.0;
    pdVar22[1] = dVar52 + dVar43 + 0.0;
    dVar43 = (double)stateObservation::tools::ProbabilityLawSimulation::getUniformScalar(0.5,1.5);
    local_768.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[(long)dVar46] = dVar43;
    dVar45 = (double)(((long)local_b88.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)local_b88.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_b88.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_b88.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_b88.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_b88.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_b88.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20);
    if (((dVar45 == 0.0) || ((long)dVar46 < 0)) || ((long)dVar45 <= (long)dVar46))
    goto LAB_0010736e;
    lVar36 = (long)local_b88.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur -
             (long)local_b88.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 4;
    uVar34 = lVar36 + (long)dVar46;
    if ((long)uVar34 < 0) {
      uVar41 = (long)uVar34 >> 5;
LAB_001048e9:
      pMVar31 = (_Elt_pointer)
                ((long)&(local_b88.
                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41]->
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                        m_data + (ulong)(((uint)uVar34 & 0x1f) << 4));
      pMVar25 = local_b88.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20;
    }
    else {
      if (0x1f < uVar34) {
        uVar41 = uVar34 >> 5;
        goto LAB_001048e9;
      }
      pMVar31 = local_b88.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur + (long)dVar46;
      pMVar25 = pMVar31;
    }
    lVar39 = ((long)local_9d8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_9d8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
             ((long)local_9d8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_9d8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)local_9d8.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_9d8.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_9d8.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20
    ;
    if (((lVar39 == 0) || ((long)dVar46 < local_9e0)) || (local_9e0 + lVar39 <= (long)dVar46))
    goto LAB_0010736e;
    uVar34 = ((long)local_9d8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_9d8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
             ((long)dVar46 - local_9e0);
    if ((long)uVar34 < 0) {
      uVar41 = (long)uVar34 >> 5;
LAB_001049b9:
      pMVar40 = local_9d8.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20;
    }
    else {
      if (0x1f < uVar34) {
        uVar41 = uVar34 >> 5;
        goto LAB_001049b9;
      }
      pMVar40 = local_9d8.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur + ((long)dVar46 - local_9e0);
    }
    uVar34 = (pMVar40->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    pMVar24 = (_Elt_pointer)
              local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
              m_data.array[1];
    if ((long)uVar34 < 0) goto LAB_001073ac;
    if ((pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        != uVar34) {
      pcVar30 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
      ;
      goto LAB_001074a9;
    }
    lVar39 = ((long)local_a30.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_a30.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
             ((long)local_a30.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_a30.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)local_a30.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_a30.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_a30.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20
    ;
    if (((lVar39 == 0) || ((long)dVar46 < local_a38)) || (local_a38 + lVar39 <= (long)dVar46))
    goto LAB_0010736e;
    uVar41 = ((long)local_a30.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_a30.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
             ((long)dVar46 - local_a38);
    if ((long)uVar41 < 0) {
      uVar32 = (long)uVar41 >> 5;
LAB_00104a95:
      pMVar24 = local_a30.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar32] + uVar41 + uVar32 * -0x20;
    }
    else {
      if (0x1f < uVar41) {
        uVar32 = uVar41 >> 5;
        goto LAB_00104a95;
      }
      pMVar24 = local_a30.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur + ((long)dVar46 - local_a38);
    }
    if (uVar34 != (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_rows) {
      pcVar30 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_001074a9;
    }
    if ((pMVar31->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        != uVar34) {
      pcVar30 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>>]"
      ;
      goto LAB_001074a9;
    }
    dVar47 = (double)((long)dVar46 + 1);
    if ((ulong)dVar45 <= (ulong)dVar47) goto LAB_0010736e;
    uVar41 = lVar36 + (long)dVar47;
    if ((long)uVar41 < 0) {
      uVar32 = (long)uVar41 >> 5;
LAB_00104b05:
      pDVar35 = (DenseStorage<double,__1,__1,_1,_0> *)
                (local_b88.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node[uVar32] + uVar41 + uVar32 * -0x20)
      ;
    }
    else {
      if (0x1f < uVar41) {
        uVar32 = uVar41 >> 5;
        goto LAB_00104b05;
      }
      pDVar35 = (DenseStorage<double,__1,__1,_1,_0> *)
                (local_b88.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur + (long)dVar47);
    }
    pdVar22 = (pMVar31->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    pdVar21 = (pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    pdVar23 = (pMVar40->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    pdVar7 = (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    local_798 = dVar47;
    local_788 = dVar46;
    if ((pDVar35->m_rows != uVar34) &&
       (Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize(pDVar35,uVar34,uVar34,1),
       pDVar35->m_rows != uVar34)) {
      pcVar30 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>>>, T1 = double, T2 = double]"
      ;
      goto LAB_0010759a;
    }
    dVar45 = local_788;
    dVar46 = local_798;
    pdVar8 = pDVar35->m_data;
    uVar41 = uVar34 & 0x7ffffffffffffffe;
    if (1 < uVar34) {
      uVar32 = 0;
      do {
        pdVar1 = pdVar21 + uVar32;
        dVar54 = pdVar1[1];
        pdVar4 = pdVar23 + uVar32;
        dVar6 = pdVar4[1];
        pdVar5 = pdVar7 + uVar32;
        dVar47 = pdVar5[1];
        pdVar2 = pdVar22 + uVar32;
        dVar52 = pdVar2[1];
        pdVar3 = pdVar8 + uVar32;
        *pdVar3 = ((*pdVar1 - *pdVar4 * dVar43) + *pdVar5) * 0.01649915822768611 + *pdVar2;
        pdVar3[1] = ((dVar54 - dVar6 * dVar43) + dVar47) * 0.01649915822768611 + dVar52;
        uVar32 = uVar32 + 2;
      } while (uVar32 < uVar41);
    }
    for (; uVar41 != uVar34; uVar41 = uVar41 + 1) {
      pdVar8[uVar41] =
           ((pdVar21[uVar41] - pdVar23[uVar41] * dVar43) + pdVar7[uVar41]) * 0.01649915822768611 +
           pdVar22[uVar41];
    }
    lVar36 = ((long)local_b00.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_b00.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
             ((long)local_b00.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_b00.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)local_b00.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_b00.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_b00.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20
    ;
    if (((lVar36 == 0) || ((long)local_788 < local_b08)) || (local_b08 + lVar36 <= (long)local_788))
    goto LAB_0010736e;
    uVar34 = ((long)local_b00.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_b00.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
             ((long)local_788 - local_b08);
    if ((long)uVar34 < 0) {
      uVar41 = (long)uVar34 >> 5;
LAB_00104cc4:
      pMVar24 = local_b00.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20;
    }
    else {
      if (0x1f < uVar34) {
        uVar41 = uVar34 >> 5;
        goto LAB_00104cc4;
      }
      pMVar24 = local_b00.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur + ((long)local_788 - local_b08);
    }
    local_6a8 = 1.0;
    dStack_6a0 = 0.0;
    dStack_698 = 0.0;
    dStack_690 = 1.0;
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [0] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [1] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [2] = (double)&local_6a8;
    if ((pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        != 2) {
      pcVar30 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, 2, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, 2, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>]"
      ;
      goto LAB_001074a9;
    }
    lVar36 = ((long)local_b00.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_b00.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
             ((long)local_b00.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_b00.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)local_b00.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_b00.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_b00.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20
    ;
    if (((lVar36 == 0) || ((long)dVar46 < local_b08)) || (local_b08 + lVar36 <= (long)dVar46))
    goto LAB_0010736e;
    uVar34 = ((long)local_b00.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_b00.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
             ((long)dVar46 - local_b08);
    if ((long)uVar34 < 0) {
      uVar41 = (long)uVar34 >> 5;
LAB_00104dec:
      pMVar25 = local_b00.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20;
    }
    else {
      if (0x1f < uVar34) {
        uVar41 = uVar34 >> 5;
        goto LAB_00104dec;
      }
      pMVar25 = local_b00.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur + ((long)dVar46 - local_b08);
    }
    dVar52 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[0] * local_6a8;
    dVar54 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[0] * dStack_6a0;
    dVar43 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[1] * dStack_698;
    dVar47 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[1] * dStack_690;
    pdVar22 = (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    pdVar21 = (pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    if ((pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        != 2) {
      local_7a8 = dVar43;
      dStack_7a0 = dVar47;
      free(pdVar21);
      pdVar21 = (double *)malloc(0x10);
      if (((ulong)pdVar21 & 0xf) != 0) goto LAB_0010738d;
      if (pdVar21 == (double *)0x0) {
        puVar29 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar29 = std::ios::widen;
        __cxa_throw(puVar29,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      (pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           pdVar21;
      (pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 2
      ;
      dVar43 = local_7a8;
      dVar47 = dStack_7a0;
    }
    dVar6 = pdVar22[1];
    *pdVar21 = (dVar52 + dVar43 + 0.0) * 0.005 * 0.005 + *pdVar22;
    pdVar21[1] = (dVar54 + dVar47 + 0.0) * 0.005 * 0.005 + dVar6;
    local_6c8 = 1.0;
    dStack_6c0 = 0.0;
    dStack_6b8 = 0.0;
    dStack_6b0 = 1.0;
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [0] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [1] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [2] = (double)&local_6c8;
    dVar43 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[0] * local_6c8;
    dVar47 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[0] * dStack_6c0;
    dVar52 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[1] * dStack_6b8;
    dVar54 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[1] * dStack_6b0;
    lVar36 = ((long)local_b88.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_b88.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
             ((long)local_b88.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_b88.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)local_b88.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_b88.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_b88.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20
    ;
    if (((lVar36 == 0) || ((long)dVar45 < 0)) || (lVar36 <= (long)dVar45)) goto LAB_0010736e;
    uVar34 = ((long)local_b88.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_b88.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + (long)dVar45;
    if ((long)uVar34 < 0) {
      uVar41 = (long)uVar34 >> 5;
LAB_00104ffb:
      pMVar25 = local_b88.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20;
    }
    else {
      if (0x1f < uVar34) {
        uVar41 = uVar34 >> 5;
        goto LAB_00104ffb;
      }
      pMVar25 = local_b88.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur + (long)dVar45;
    }
    lVar36 = (pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    pMVar24 = (_Elt_pointer)
              local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
              m_data.array[1];
    if (lVar36 < 0) goto LAB_001073ac;
    lVar39 = ((long)local_a30.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_a30.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
             ((long)local_a30.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_a30.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)local_a30.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_a30.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_a30.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20
    ;
    if (((lVar39 == 0) || ((long)dVar45 < local_a38)) || (local_a38 + lVar39 <= (long)dVar45))
    goto LAB_0010736e;
    uVar34 = ((long)local_a30.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_a30.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
             ((long)dVar45 - local_a38);
    if ((long)uVar34 < 0) {
      uVar41 = (long)uVar34 >> 5;
LAB_001050cd:
      pMVar24 = local_a30.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20;
    }
    else {
      if (0x1f < uVar34) {
        uVar41 = uVar34 >> 5;
        goto LAB_001050cd;
      }
      pMVar24 = local_a30.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur + ((long)dVar45 - local_a38);
    }
    if (lVar36 != (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_rows) {
      pcVar30 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_001074a9;
    }
    local_788 = 1.0 / local_768.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)dVar45];
    uStack_780 = 0;
    local_6e8 = 1.0;
    dStack_6e0 = 0.0;
    dStack_6d8 = 0.0;
    dStack_6d0 = 1.0;
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [0] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [1] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [2] = (double)&local_6e8;
    if ((pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        != 2) {
      pcVar30 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, 2, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, 2, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>]"
      ;
      goto LAB_001074a9;
    }
    dVar45 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[1] * dStack_6d0;
    local_988.m_angle = 1.6060915267313265;
    lVar36 = ((long)local_9d8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_9d8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
             ((long)local_9d8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_9d8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)local_9d8.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_9d8.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_9d8.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20
    ;
    dStack_980.
    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)pMVar25;
    if (((lVar36 == 0) || ((long)dVar46 < local_9e0)) || (local_9e0 + lVar36 <= (long)dVar46))
    goto LAB_0010736e;
    uVar34 = ((long)local_9d8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_9d8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
             ((long)dVar46 - local_9e0);
    if ((long)uVar34 < 0) {
      uVar41 = (long)uVar34 >> 5;
LAB_00105275:
      pMVar31 = local_9d8.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20;
    }
    else {
      if (0x1f < uVar34) {
        uVar41 = uVar34 >> 5;
        goto LAB_00105275;
      }
      pMVar31 = local_9d8.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur + ((long)dVar46 - local_9e0);
    }
    pdVar22 = (pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    pdVar21 = (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    pdVar23 = (pMVar31->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    dVar55 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[0] * local_6e8;
    dVar56 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[0] * dStack_6e0;
    dVar57 = 1.6060915267313265;
    dVar6 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
            m_data.array[1] * dStack_6d8;
    if ((pMVar31->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        != 2) {
      local_608 = 1.6060915267313265;
      local_5f8._8_4_ = SUB84(dVar45,0);
      local_5f8._0_8_ =
           local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
           m_data.array[1] * dStack_6d8;
      local_5f8._12_4_ = (int)((ulong)dVar45 >> 0x20);
      local_7a8 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                  m_storage.m_data.array[0] * local_6e8;
      dStack_7a0 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                   m_storage.m_data.array[0] * dStack_6e0;
      pMStack_600 = pMVar25;
      free(pdVar23);
      pdVar23 = (double *)malloc(0x10);
      if (((ulong)pdVar23 & 0xf) != 0) goto LAB_0010738d;
      if (pdVar23 == (double *)0x0) {
        puVar29 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar29 = std::ios::widen;
        __cxa_throw(puVar29,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      (pMVar31->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           pdVar23;
      (pMVar31->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 2
      ;
      dVar55 = local_7a8;
      dVar56 = dStack_7a0;
      dVar57 = local_608;
      dVar6 = (double)local_5f8._0_8_;
      dVar45 = (double)local_5f8._8_8_;
    }
    dVar51 = dVar51 + (dVar52 + dVar43 + 0.0) * 0.05;
    dVar53 = dVar53 + (dVar54 + dVar47 + 0.0) * 0.05;
    dVar47 = pdVar22[1];
    dVar43 = pdVar21[1];
    *pdVar23 = (dVar55 + dVar6 + 0.0) * 0.05 + (dVar57 * *pdVar22 + *pdVar21) * local_788 + dVar51;
    pdVar23[1] = (dVar56 + dVar45 + 0.0) * 0.05 + (dVar57 * dVar47 + dVar43) * local_788 + dVar53;
    dVar45 = local_788;
  } while (dVar46 != 1.18570814345441e-319);
  lVar36 = 0;
  lVar39 = 0;
  do {
    local_988.m_angle =
         (Scalar)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar
                           (6.283185307179586,0.0);
    local_750.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar39] = local_988.m_angle;
    lVar37 = ((long)local_b00.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_b00.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
             ((long)local_b00.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_b00.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)local_b00.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_b00.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_b00.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20
    ;
    if (((lVar37 == 0) || (lVar39 < local_b08)) || (lVar37 + local_b08 <= lVar39))
    goto LAB_0010736e;
    lVar37 = ((long)local_b00.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_b00.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - local_b08;
    uVar34 = lVar39 + lVar37;
    if ((long)uVar34 < 0) {
      uVar34 = (long)uVar34 >> 5;
LAB_0010546d:
      pMVar27 = local_b00.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                lVar37 + uVar34 * -0x20 + lVar39;
    }
    else {
      if (0x1f < uVar34) {
        uVar34 = uVar34 >> 5;
        goto LAB_0010546d;
      }
      pMVar27 = (Matrix<double,__1,_1,_0,__1,_1> *)
                ((long)&local_b00.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur[-local_b08].
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data + lVar36);
    }
    Eigen::Rotation2D<double>::toRotationMatrix(local_578,&local_988);
    if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        != 2) {
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                    "Eigen::Product<Eigen::Matrix<double, 2, 2>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 2, 2>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                   );
    }
    lVar37 = ((long)local_7f8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_7f8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
             ((long)local_7f8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_7f8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)local_7f8.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_7f8.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_7f8.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20
    ;
    if (((lVar37 == 0) || (lVar39 < local_800)) || (lVar37 + local_800 <= lVar39))
    goto LAB_0010736e;
    lVar37 = ((long)local_7f8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_7f8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - local_800;
    uVar34 = lVar39 + lVar37;
    if ((long)uVar34 < 0) {
      uVar34 = (long)uVar34 >> 5;
LAB_0010554b:
      pMVar33 = local_7f8.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                lVar37 + uVar34 * -0x20 + lVar39;
    }
    else {
      if (0x1f < uVar34) {
        uVar34 = uVar34 >> 5;
        goto LAB_0010554b;
      }
      pMVar33 = (Matrix<double,__1,_1,_0,__1,_1> *)
                ((long)&local_7f8.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur[-local_800].
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data + lVar36);
    }
    pdVar22 = (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    dStack_bb0 = *pdVar22;
    dVar45 = dStack_bb0 *
             local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[0];
    dStack_bb0 = dStack_bb0 *
                 local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage
                 .m_data.array[1];
    dVar46 = pdVar22[1];
    dVar51 = dVar46 * local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                      m_storage.m_data.array[2];
    dVar46 = dVar46 * local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                      m_storage.m_data.array[3];
    pauVar20 = (undefined1 (*) [16])
               (pMVar33->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
    if ((pMVar33->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        != 2) {
      auVar12._8_4_ = SUB84(dStack_bb0,0);
      auVar12._0_8_ = dVar45;
      auVar12._12_4_ = (int)((ulong)dStack_bb0 >> 0x20);
      free(pauVar20);
      pauVar20 = (undefined1 (*) [16])malloc(0x10);
      if (((ulong)pauVar20 & 0xf) != 0) goto LAB_0010738d;
      if (pauVar20 == (undefined1 (*) [16])0x0) {
        puVar29 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar29 = std::ios::widen;
        __cxa_throw(puVar29,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      (pMVar33->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           (double *)pauVar20;
      (pMVar33->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 2
      ;
      dStack_bb0 = auVar12._8_8_;
    }
    dStack_bb0 = dStack_bb0 + dVar46;
    auVar13._8_4_ = SUB84(dStack_bb0,0);
    auVar13._0_8_ = dVar45 + dVar51;
    auVar13._12_4_ = (int)((ulong)dStack_bb0 >> 0x20);
    *pauVar20 = auVar13;
    lVar39 = lVar39 + 1;
    lVar36 = lVar36 + 0x10;
  } while (lVar39 != 24000);
  local_988.m_angle = 0.0;
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::deque(&dStack_980,24000,(allocator_type *)local_578);
  local_858 = 0;
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::deque(&local_850,24000,(allocator_type *)local_578);
  local_930 = 0;
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::deque(&local_928,24000,(allocator_type *)local_578);
  lVar36 = 0;
  do {
    lVar39 = ((long)local_b88.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_b88.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
             ((long)local_b88.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_b88.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)local_b88.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_b88.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_b88.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20
    ;
    if (((lVar39 == 0) || (lVar36 < 0)) || (lVar39 <= lVar36)) goto LAB_0010736e;
    uVar34 = ((long)local_b88.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_b88.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + lVar36;
    if ((long)uVar34 < 0) {
      uVar41 = (long)uVar34 >> 5;
LAB_0010570b:
      pMVar24 = local_b88.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20;
    }
    else {
      if (0x1f < uVar34) {
        uVar41 = uVar34 >> 5;
        goto LAB_0010570b;
      }
      pMVar24 = local_b88.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur + lVar36;
    }
    local_708 = 1.0;
    dStack_700 = 0.0;
    dStack_6f8 = 0.0;
    dStack_6f0 = 1.0;
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [0] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [1] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [2] = (double)&local_708;
    if ((pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        != 2) {
LAB_001073cb:
      pcVar30 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, 2, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, 2, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>]"
      ;
      goto LAB_001074a9;
    }
    lVar39 = ((long)dStack_980.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)dStack_980.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
             ((long)dStack_980.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)dStack_980.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)dStack_980.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)dStack_980.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(dStack_980.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20
    ;
    if (((lVar39 == 0) || (lVar36 < (long)local_988.m_angle)) ||
       ((long)local_988.m_angle + lVar39 <= lVar36)) goto LAB_0010736e;
    uVar34 = ((long)dStack_980.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)dStack_980.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
             (lVar36 - (long)local_988.m_angle);
    if ((long)uVar34 < 0) {
      uVar41 = (long)uVar34 >> 5;
LAB_0010583f:
      pMVar25 = dStack_980.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20;
    }
    else {
      if (0x1f < uVar34) {
        uVar41 = uVar34 >> 5;
        goto LAB_0010583f;
      }
      pMVar25 = dStack_980.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar36 - (long)local_988.m_angle)
      ;
    }
    dVar46 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[0] * local_708;
    dStack_bb0 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage
                 .m_data.array[0] * dStack_700;
    dVar45 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[1] * dStack_6f8;
    dVar51 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[1] * dStack_6f0;
    pdVar22 = (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    pauVar20 = (undefined1 (*) [16])
               (pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
    if ((pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        != 2) {
      auVar14._8_4_ = SUB84(dStack_bb0,0);
      auVar14._0_8_ = dVar46;
      auVar14._12_4_ = (int)((ulong)dStack_bb0 >> 0x20);
      free(pauVar20);
      pauVar20 = (undefined1 (*) [16])malloc(0x10);
      if (((ulong)pauVar20 & 0xf) != 0) goto LAB_0010738d;
      if (pauVar20 == (undefined1 (*) [16])0x0) {
        puVar29 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar29 = std::ios::widen;
        __cxa_throw(puVar29,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      (pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           (double *)pauVar20;
      (pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 2
      ;
      dStack_bb0 = auVar14._8_8_;
    }
    dVar51 = (dStack_bb0 + dVar51 + 0.0) * 0.005 + pdVar22[1];
    auVar15._8_4_ = SUB84(dVar51,0);
    auVar15._0_8_ = (dVar46 + dVar45 + 0.0) * 0.005 + *pdVar22;
    auVar15._12_4_ = (int)((ulong)dVar51 >> 0x20);
    *pauVar20 = auVar15;
    lVar39 = ((long)dStack_980.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)dStack_980.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
             ((long)dStack_980.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)dStack_980.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)dStack_980.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)dStack_980.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(dStack_980.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20
    ;
    if (((lVar39 == 0) || (lVar36 < (long)local_988.m_angle)) ||
       ((long)local_988.m_angle + lVar39 <= lVar36)) goto LAB_0010736e;
    uVar34 = ((long)dStack_980.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)dStack_980.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
             (lVar36 - (long)local_988.m_angle);
    if ((long)uVar34 < 0) {
      uVar41 = (long)uVar34 >> 5;
LAB_0010599f:
      pMVar24 = dStack_980.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20;
    }
    else {
      if (0x1f < uVar34) {
        uVar41 = uVar34 >> 5;
        goto LAB_0010599f;
      }
      pMVar24 = dStack_980.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar36 - (long)local_988.m_angle)
      ;
    }
    lVar39 = ((long)local_7f8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_7f8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
             ((long)local_7f8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_7f8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)local_7f8.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_7f8.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_7f8.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20
    ;
    if (((lVar39 == 0) || (lVar36 < local_800)) || (local_800 + lVar39 <= lVar36))
    goto LAB_0010736e;
    uVar34 = ((long)local_7f8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_7f8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + (lVar36 - local_800);
    if ((long)uVar34 < 0) {
      uVar41 = (long)uVar34 >> 5;
LAB_00105a64:
      pMVar25 = local_7f8.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20;
    }
    else {
      if (0x1f < uVar34) {
        uVar41 = uVar34 >> 5;
        goto LAB_00105a64;
      }
      pMVar25 = local_7f8.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar36 - local_800);
    }
    uVar34 = (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (uVar34 != (pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_rows) {
      pcVar30 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_001074a9;
    }
    lVar39 = ((long)local_850.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_850.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
             ((long)local_850.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_850.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)local_850.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_850.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_850.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20
    ;
    if (((lVar39 == 0) || (lVar36 < local_858)) || (local_858 + lVar39 <= lVar36))
    goto LAB_0010736e;
    uVar41 = ((long)local_850.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_850.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + (lVar36 - local_858);
    if ((long)uVar41 < 0) {
      uVar32 = (long)uVar41 >> 5;
LAB_00105b37:
      pDVar35 = (DenseStorage<double,__1,__1,_1,_0> *)
                (local_850.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node[uVar32] + uVar41 + uVar32 * -0x20)
      ;
    }
    else {
      if (0x1f < uVar41) {
        uVar32 = uVar41 >> 5;
        goto LAB_00105b37;
      }
      pDVar35 = (DenseStorage<double,__1,__1,_1,_0> *)
                (local_850.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar36 - local_858));
    }
    pdVar22 = (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    pdVar21 = (pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    if (pDVar35->m_rows != uVar34) {
      if ((long)uVar34 < 0) {
        pcVar30 = 
        "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_0010762c;
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize(pDVar35,uVar34,uVar34,1);
      if (pDVar35->m_rows != uVar34) {
        pcVar30 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
        ;
LAB_0010759a:
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar30);
      }
    }
    pdVar23 = pDVar35->m_data;
    uVar41 = uVar34 - ((long)uVar34 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar34) {
      lVar39 = 0;
      do {
        pdVar7 = pdVar22 + lVar39;
        pdVar8 = pdVar21 + lVar39;
        dVar46 = pdVar7[1] + pdVar8[1];
        auVar16._8_4_ = SUB84(dVar46,0);
        auVar16._0_8_ = *pdVar7 + *pdVar8;
        auVar16._12_4_ = (int)((ulong)dVar46 >> 0x20);
        *(undefined1 (*) [16])(pdVar23 + lVar39) = auVar16;
        lVar39 = lVar39 + 2;
      } while (lVar39 < (long)uVar41);
    }
    if ((long)uVar41 < (long)uVar34) {
      do {
        pdVar23[uVar41] = pdVar22[uVar41] + pdVar21[uVar41];
        uVar41 = uVar41 + 1;
      } while (uVar34 != uVar41);
    }
    lVar39 = ((long)local_9d8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_9d8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
             ((long)local_9d8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_9d8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)local_9d8.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_9d8.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_9d8.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20
    ;
    if (((lVar39 == 0) || (lVar36 < local_9e0)) || (local_9e0 + lVar39 <= lVar36))
    goto LAB_0010736e;
    uVar34 = ((long)local_9d8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_9d8.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + (lVar36 - local_9e0);
    if ((long)uVar34 < 0) {
      uVar41 = (long)uVar34 >> 5;
LAB_00105c89:
      pMVar24 = local_9d8.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20;
    }
    else {
      if (0x1f < uVar34) {
        uVar41 = uVar34 >> 5;
        goto LAB_00105c89;
      }
      pMVar24 = local_9d8.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar36 - local_9e0);
    }
    local_728 = 1.0;
    dStack_720 = 0.0;
    dStack_718 = 0.0;
    dStack_710 = 1.0;
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [0] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [1] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
    local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [2] = (double)&local_728;
    if ((pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        != 2) goto LAB_001073cb;
    lVar39 = ((long)local_928.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_928.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
             ((long)local_928.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_928.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)local_928.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_928.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_928.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20
    ;
    if (((lVar39 == 0) || (lVar36 < local_930)) || (local_930 + lVar39 <= lVar36))
    goto LAB_0010736e;
    uVar34 = ((long)local_928.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_928.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + (lVar36 - local_930);
    if ((long)uVar34 < 0) {
      uVar41 = (long)uVar34 >> 5;
LAB_00105db5:
      pMVar25 = local_928.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20;
    }
    else {
      if (0x1f < uVar34) {
        uVar41 = uVar34 >> 5;
        goto LAB_00105db5;
      }
      pMVar25 = local_928.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar36 - local_930);
    }
    dVar46 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[0] * local_728;
    dStack_bb0 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage
                 .m_data.array[0] * dStack_720;
    dVar45 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[1] * dStack_718;
    dVar51 = local_578[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
             m_data.array[1] * dStack_710;
    pdVar22 = (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    pauVar20 = (undefined1 (*) [16])
               (pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
    if ((pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        != 2) {
      auVar17._8_4_ = SUB84(dStack_bb0,0);
      auVar17._0_8_ = dVar46;
      auVar17._12_4_ = (int)((ulong)dStack_bb0 >> 0x20);
      free(pauVar20);
      pauVar20 = (undefined1 (*) [16])malloc(0x10);
      if (((ulong)pauVar20 & 0xf) != 0) goto LAB_0010738d;
      if (pauVar20 == (undefined1 (*) [16])0x0) {
        puVar29 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar29 = std::ios::widen;
        __cxa_throw(puVar29,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      (pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           (double *)pauVar20;
      (pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 2
      ;
      dStack_bb0 = auVar17._8_8_;
    }
    dVar51 = (dStack_bb0 + dVar51 + 0.0) * 0.001 + pdVar22[1];
    auVar18._8_4_ = SUB84(dVar51,0);
    auVar18._0_8_ = (dVar46 + dVar45 + 0.0) * 0.001 + *pdVar22;
    auVar18._12_4_ = (int)((ulong)dVar51 >> 0x20);
    *pauVar20 = auVar18;
    lVar36 = lVar36 + 1;
  } while (lVar36 != 24000);
  local_ab0 = 0;
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::deque(&local_aa8,24000,(allocator_type *)local_578);
  local_8b0 = 0;
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::deque(&local_8a8,24000,(allocator_type *)local_578);
  local_5e8 = 0;
  uStack_5e0 = 0;
  local_5d8._0_8_ = -1.0;
  local_5d8._8_8_ = -1.0;
  local_b38._0_8_ = (Matrix *)0x0;
  local_b38.m_xpr.m_lhs = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
  local_a58 = (undefined1  [8])0x0;
  dStack_a50 = 0.0;
  local_8c8 = 0.0;
  dStack_8c0 = 0.0;
  local_778.m_angle = 0.01;
  dStack_770 = 0.01;
  local_738.m_angle = 0.01;
  uStack_730 = 0x3f847ae147ae147b;
  stateObservation::LipmDcmEstimator::LipmDcmEstimator
            ((LipmDcmEstimator *)local_578,0.005,3.2998316455372216,0.005,0.005,0.001,
             (Matrix *)local_5d8,(Matrix *)&local_b38,(Matrix *)local_a58,(Matrix *)&local_8c8,
             (Matrix *)&local_778,(Matrix *)&local_738);
  lVar36 = ((long)local_850.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_850.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
           ((long)local_850.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_850.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)local_850.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_850.
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_850.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20;
  if (((lVar36 == 0) || (0 < local_858)) || (lVar36 + local_858 < 1)) goto LAB_0010736e;
  uVar34 = ((long)local_850.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
            (long)local_850.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - local_858;
  if ((long)uVar34 < 0) {
    uVar41 = (long)uVar34 >> 5;
LAB_00105ffe:
    pMVar24 = local_850.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20;
  }
  else {
    if (0x1f < uVar34) {
      uVar41 = uVar34 >> 5;
      goto LAB_00105ffe;
    }
    pMVar24 = local_850.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur + -local_858;
  }
  if ((pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      2) goto LAB_00107617;
  pdVar22 = (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_data;
  local_b38._0_8_ = *pdVar22;
  local_b38.m_xpr.m_lhs = (LhsNested)pdVar22[1];
  lVar36 = ((long)local_928.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_928.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
           ((long)local_928.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_928.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)local_928.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_928.
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_928.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20;
  if (((lVar36 == 0) || (0 < local_930)) || (lVar36 + local_930 < 1)) {
LAB_0010736e:
    __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                  ,0x192,
                  "void stateObservation::IndexedMatrixArrayT<Eigen::Matrix<double, -1, 1>>::check_(TimeIndex) const [MatrixType = Eigen::Matrix<double, -1, 1>, Allocator = std::allocator<Eigen::Matrix<double, -1, 1>>]"
                 );
  }
  uVar34 = ((long)local_928.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
            (long)local_928.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - local_930;
  if ((long)uVar34 < 0) {
    uVar41 = (long)uVar34 >> 5;
LAB_001060de:
    pMVar24 = local_928.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20;
  }
  else {
    if (0x1f < uVar34) {
      uVar41 = uVar34 >> 5;
      goto LAB_001060de;
    }
    pMVar24 = local_928.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur + -local_930;
  }
  if ((pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      2) {
    pdVar22 = (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    local_a58 = (undefined1  [8])*pdVar22;
    dStack_a50 = pdVar22[1];
    local_778.m_angle =
         *local_750.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
    local_8c8 = 0.01;
    dStack_8c0 = 0.01;
    Eigen::Rotation2D<double>::toRotationMatrix((Matrix2 *)local_5d8,&local_778);
    stateObservation::LipmDcmEstimator::resetWithMeasurements
              ((Matrix *)local_578,(Matrix *)&local_b38,(Matrix *)local_a58,SUB81(local_5d8,0),
               (Matrix *)0x1,(Matrix *)&local_5e8);
    local_598 = 0;
    uStack_590 = 0;
    local_5a8 = 0;
    uStack_5a0 = 0;
    local_5b8 = 0;
    uStack_5b0 = 0;
    local_5c8 = 0.0;
    dStack_5c0 = 0.0;
    local_5d8._0_8_ = 0.0;
    local_5d8._8_8_ = 0.0;
    local_588 = 0;
    std::
    _Deque_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::_M_initialize_map((_Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)(local_5d8 + 8),0);
    lVar36 = 1;
    do {
      lVar39 = ((long)local_850.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_850.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
               ((long)local_850.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_850.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
               ((((ulong)((long)local_850.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (long)local_850.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(local_850.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
               0x20;
      if (((lVar39 == 0) || (lVar36 < local_858)) || (local_858 + lVar39 <= lVar36))
      goto LAB_0010736e;
      uVar34 = ((long)local_850.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)local_850.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + (lVar36 - local_858)
      ;
      if ((long)uVar34 < 0) {
        uVar41 = (long)uVar34 >> 5;
LAB_0010627b:
        pMVar24 = local_850.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20
        ;
      }
      else {
        if (0x1f < uVar34) {
          uVar41 = uVar34 >> 5;
          goto LAB_0010627b;
        }
        pMVar24 = local_850.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar36 - local_858);
      }
      if ((pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
          != 2) goto LAB_00107617;
      pdVar22 = (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      local_a58 = (undefined1  [8])*pdVar22;
      dStack_a50 = pdVar22[1];
      lVar39 = ((long)local_928.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_928.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
               ((long)local_928.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_928.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
               ((((ulong)((long)local_928.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (long)local_928.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(local_928.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
               0x20;
      if (((lVar39 == 0) || (lVar36 < local_930)) || (local_930 + lVar39 <= lVar36))
      goto LAB_0010736e;
      uVar34 = ((long)local_928.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)local_928.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + (lVar36 - local_930)
      ;
      if ((long)uVar34 < 0) {
        uVar41 = (long)uVar34 >> 5;
LAB_0010635b:
        pMVar24 = local_928.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20
        ;
      }
      else {
        if (0x1f < uVar34) {
          uVar41 = uVar34 >> 5;
          goto LAB_0010635b;
        }
        pMVar24 = local_928.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar36 - local_930);
      }
      if ((pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
          != 2) goto LAB_00107617;
      pdVar22 = (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      local_8c8 = *pdVar22;
      dStack_8c0 = pdVar22[1];
      lVar39 = ((long)local_a30.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_a30.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
               ((long)local_a30.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_a30.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
               ((((ulong)((long)local_a30.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (long)local_a30.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(local_a30.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
               0x20;
      if (((lVar39 == 0) || (lVar36 <= local_a38)) || (lVar39 + local_a38 < lVar36))
      goto LAB_0010736e;
      lVar39 = (lVar36 + -1) - local_a38;
      uVar34 = ((long)local_a30.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)local_a30.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + lVar39;
      if ((long)uVar34 < 0) {
        uVar41 = (long)uVar34 >> 5;
LAB_0010643f:
        pMVar24 = local_a30.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20
        ;
      }
      else {
        if (0x1f < uVar34) {
          uVar41 = uVar34 >> 5;
          goto LAB_0010643f;
        }
        pMVar24 = local_a30.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur + lVar39;
      }
      if ((pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
          != 2) goto LAB_00107617;
      local_738.m_angle =
           local_750.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar36];
      pdVar22 = (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      local_778.m_angle = *pdVar22;
      dStack_770 = pdVar22[1];
      dVar46 = local_768.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar36 + -1];
      Eigen::Rotation2D<double>::toRotationMatrix((Matrix2 *)&local_b38,&local_738);
      stateObservation::LipmDcmEstimator::setInputs
                ((Matrix *)local_578,(Matrix *)local_a58,(Matrix *)&local_8c8,(Matrix *)&local_b38,
                 dVar46);
      stateObservation::LipmDcmEstimator::update();
      stateObservation::LipmDcmEstimator::getBias();
      lVar39 = ((long)local_8a8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_8a8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
               ((long)local_8a8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_8a8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
               ((((ulong)((long)local_8a8.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (long)local_8a8.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(local_8a8.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
               0x20;
      if (((lVar39 == 0) || (lVar36 < local_8b0)) || (local_8b0 + lVar39 <= lVar36))
      goto LAB_0010736e;
      uVar34 = ((long)local_8a8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)local_8a8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + (lVar36 - local_8b0)
      ;
      if ((long)uVar34 < 0) {
        uVar41 = (long)uVar34 >> 5;
LAB_0010658e:
        pMVar24 = local_8a8.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20
        ;
      }
      else {
        if (0x1f < uVar34) {
          uVar41 = uVar34 >> 5;
          goto LAB_0010658e;
        }
        pMVar24 = local_8a8.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar36 - local_8b0);
      }
      pdVar22 = (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      if ((pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
          != 2) {
        free(pdVar22);
        pdVar22 = (double *)malloc(0x10);
        if (((ulong)pdVar22 & 0xf) != 0) goto LAB_0010738d;
        if (pdVar22 == (double *)0x0) {
          puVar29 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar29 = std::ios::widen;
          __cxa_throw(puVar29,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
             pdVar22;
        (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
             2;
      }
      *pdVar22 = (double)local_b38._0_8_;
      pdVar22[1] = (double)local_b38.m_xpr.m_lhs;
      stateObservation::LipmDcmEstimator::getUnbiasedDCM();
      lVar39 = ((long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
               ((long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
               ((((ulong)((long)local_aa8.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (long)local_aa8.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(local_aa8.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
               0x20;
      if (((lVar39 == 0) || (lVar36 < local_ab0)) || (local_ab0 + lVar39 <= lVar36))
      goto LAB_0010736e;
      uVar34 = ((long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + (lVar36 - local_ab0)
      ;
      if ((long)uVar34 < 0) {
        uVar41 = (long)uVar34 >> 5;
LAB_001066a5:
        pMVar24 = local_aa8.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20
        ;
      }
      else {
        if (0x1f < uVar34) {
          uVar41 = uVar34 >> 5;
          goto LAB_001066a5;
        }
        pMVar24 = local_aa8.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar36 - local_ab0);
      }
      pdVar22 = (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      if ((pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
          != 2) {
        free(pdVar22);
        pdVar22 = (double *)malloc(0x10);
        if (((ulong)pdVar22 & 0xf) != 0) goto LAB_0010738d;
        if (pdVar22 == (double *)0x0) {
          puVar29 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar29 = std::ios::widen;
          __cxa_throw(puVar29,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
             pdVar22;
        (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
             2;
      }
      *pdVar22 = (double)local_b38._0_8_;
      pdVar22[1] = (double)local_b38.m_xpr.m_lhs;
      lVar39 = ((long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
               ((long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
               ((((ulong)((long)local_aa8.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (long)local_aa8.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(local_aa8.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
               0x20;
      if (((lVar39 == 0) || (lVar36 < local_ab0)) || (local_ab0 + lVar39 <= lVar36))
      goto LAB_0010736e;
      uVar34 = ((long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + (lVar36 - local_ab0)
      ;
      if ((long)uVar34 < 0) {
        uVar41 = (long)uVar34 >> 5;
LAB_001067b1:
        pMVar25 = (_Elt_pointer)
                  ((long)&(local_aa8.
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41]->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                          m_data + (ulong)(((uint)uVar34 & 0x1f) << 4));
        pMVar24 = local_aa8.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] + uVar34 + uVar41 * -0x20
        ;
      }
      else {
        if (0x1f < uVar34) {
          uVar41 = uVar34 >> 5;
          goto LAB_001067b1;
        }
        pMVar25 = local_aa8.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar36 - local_ab0);
        pMVar24 = pMVar25;
      }
      lVar39 = (pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows;
      if (lVar39 != (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_rows) {
        pcVar30 = 
        "Eigen::CwiseBinaryOp<Eigen::numext::not_equal_to<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::numext::not_equal_to<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_001074a9;
      }
      local_b94 = errorCode;
      if (0 < lVar39) {
        lVar37 = 0;
        do {
          dVar46 = (pMVar25->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data[lVar37];
          pdVar22 = (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data + lVar37;
          if ((dVar46 != *pdVar22) || (NAN(dVar46) || NAN(*pdVar22))) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"NaN detected = ",0xf);
            poVar28 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar36);
            std::__ostream_insert<char,std::char_traits<char>>(poVar28," ",1);
            lVar39 = ((long)local_aa8.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_aa8.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_aa8.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_aa8.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_aa8.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_aa8.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_aa8.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20;
            if ((lVar39 == 0) || ((lVar36 < local_ab0 || (local_ab0 + lVar39 <= lVar36))))
            goto LAB_0010736e;
            uVar34 = ((long)local_aa8.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_aa8.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                     (lVar36 - local_ab0);
            if ((long)uVar34 < 0) {
              uVar41 = (long)uVar34 >> 5;
LAB_00107246:
              local_b38._0_8_ =
                   local_aa8.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] +
                   uVar34 + uVar41 * -0x20;
            }
            else {
              if (0x1f < uVar34) {
                uVar41 = uVar34 >> 5;
                goto LAB_00107246;
              }
              local_b38._0_8_ =
                   local_aa8.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar36 - local_ab0);
            }
            poVar28 = Eigen::operator<<(poVar28,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                                 *)&local_b38);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar28 + -0x18) + (char)poVar28);
            std::ostream::put((char)poVar28);
            std::ostream::flush();
            goto LAB_00107295;
          }
          lVar37 = lVar37 + 1;
        } while (lVar39 != lVar37);
      }
      local_a58 = (undefined1  [8])0x0;
      dStack_a50 = 0.0;
      pdVar22 = (double *)malloc(0x58);
      if (((ulong)pdVar22 & 0xf) != 0) goto LAB_0010738d;
      if (pdVar22 == (double *)0x0) {
        puVar29 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar29 = std::ios::widen;
        __cxa_throw(puVar29,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      dStack_a50 = 5.43472210425371e-323;
      local_b38.m_xpr.m_lhs = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
      local_b38.m_xpr.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)0x1;
      local_b38.m_xpr._16_8_ = 1;
      *pdVar22 = (double)(int)lVar36;
      lVar39 = ((long)local_8a8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_8a8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
               ((long)local_8a8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_8a8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
               ((((ulong)((long)local_8a8.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (long)local_8a8.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(local_8a8.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
               0x20;
      local_b38._0_8_ = (Matrix *)local_a58;
      local_a58 = (undefined1  [8])pdVar22;
      if (((lVar39 == 0) || (lVar36 < local_8b0)) || (local_8b0 + lVar39 <= lVar36))
      goto LAB_0010736e;
      uVar34 = ((long)local_8a8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)local_8a8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + (lVar36 - local_8b0)
      ;
      if ((long)uVar34 < 0) {
        uVar41 = (long)uVar34 >> 5;
LAB_00106924:
        pDVar38 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                  (local_8a8.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] +
                  uVar34 + uVar41 * -0x20);
      }
      else {
        if (0x1f < uVar34) {
          uVar41 = uVar34 >> 5;
          goto LAB_00106924;
        }
        pDVar38 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                  (local_8a8.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar36 - local_8b0));
      }
      pCVar26 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_b38,pDVar38
                          );
      lVar39 = ((long)local_b00.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_b00.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
               ((long)local_b00.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_b00.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
               ((((ulong)((long)local_b00.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (long)local_b00.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(local_b00.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
               0x20;
      if (((lVar39 == 0) || (lVar36 < local_b08)) || (local_b08 + lVar39 <= lVar36))
      goto LAB_0010736e;
      uVar34 = ((long)local_b00.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)local_b00.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + (lVar36 - local_b08)
      ;
      if ((long)uVar34 < 0) {
        uVar41 = (long)uVar34 >> 5;
LAB_001069f1:
        pDVar38 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                  (local_b00.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] +
                  uVar34 + uVar41 * -0x20);
      }
      else {
        if (0x1f < uVar34) {
          uVar41 = uVar34 >> 5;
          goto LAB_001069f1;
        }
        pDVar38 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                  (local_b00.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar36 - local_b08));
      }
      pCVar26 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)pCVar26,pDVar38);
      lVar39 = ((long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
               ((long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
               ((((ulong)((long)local_aa8.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (long)local_aa8.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(local_aa8.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
               0x20;
      if (((lVar39 == 0) || (lVar36 < local_ab0)) || (local_ab0 + lVar39 <= lVar36))
      goto LAB_0010736e;
      uVar34 = ((long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + (lVar36 - local_ab0)
      ;
      if ((long)uVar34 < 0) {
        uVar41 = (long)uVar34 >> 5;
LAB_00106abe:
        pDVar38 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                  (local_aa8.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] +
                  uVar34 + uVar41 * -0x20);
      }
      else {
        if (0x1f < uVar34) {
          uVar41 = uVar34 >> 5;
          goto LAB_00106abe;
        }
        pDVar38 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                  (local_aa8.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar36 - local_ab0));
      }
      pCVar26 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)pCVar26,pDVar38);
      lVar39 = ((long)dStack_980.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)dStack_980.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
               ((long)dStack_980.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)dStack_980.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
               ((((ulong)((long)dStack_980.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (long)dStack_980.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(dStack_980.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
               0x20;
      if (((lVar39 == 0) || (lVar36 < (long)local_988.m_angle)) ||
         ((long)local_988.m_angle + lVar39 <= lVar36)) goto LAB_0010736e;
      uVar34 = ((long)dStack_980.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)dStack_980.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
               (lVar36 - (long)local_988.m_angle);
      if ((long)uVar34 < 0) {
        uVar41 = (long)uVar34 >> 5;
LAB_00106b8b:
        pDVar38 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                  (dStack_980.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] +
                  uVar34 + uVar41 * -0x20);
      }
      else {
        if (0x1f < uVar34) {
          uVar41 = uVar34 >> 5;
          goto LAB_00106b8b;
        }
        pDVar38 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                  (dStack_980.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur +
                  (lVar36 - (long)local_988.m_angle));
      }
      pCVar26 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)pCVar26,pDVar38);
      lVar39 = ((long)local_b88.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_b88.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
               ((long)local_b88.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_b88.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
               ((((ulong)((long)local_b88.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (long)local_b88.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(local_b88.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
               0x20;
      if (((lVar39 == 0) || (lVar36 < 0)) || (lVar39 <= lVar36)) goto LAB_0010736e;
      uVar34 = ((long)local_b88.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)local_b88.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + lVar36;
      if ((long)uVar34 < 0) {
        uVar41 = (long)uVar34 >> 5;
LAB_00106c43:
        pDVar38 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                  (local_b88.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] +
                  uVar34 + uVar41 * -0x20);
      }
      else {
        if (0x1f < uVar34) {
          uVar41 = uVar34 >> 5;
          goto LAB_00106c43;
        }
        pDVar38 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                  (local_b88.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur + lVar36);
      }
      Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)pCVar26,pDVar38);
      if (((long)&((local_b38.m_xpr.m_lhs)->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
           local_b38.m_xpr._16_8_ != *(long *)(local_b38._0_8_ + 8)) ||
         (local_b38.m_xpr.m_rhs != (Matrix<double,__1,_1,_0,__1,_1> *)0x1)) {
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      std::
      deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::push_back((deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)(local_5d8 + 8),(value_type *)local_a58);
      free((void *)local_a58);
      lVar36 = lVar36 + 1;
    } while (lVar36 != 24000);
    local_bb8 = 0.0;
    lVar36 = 0x5db6;
    lVar39 = 0x5db60;
    do {
      lVar37 = ((long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
               ((long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
               ((((ulong)((long)local_aa8.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (long)local_aa8.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(local_aa8.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
               0x20;
      if (((lVar37 == 0) || (lVar36 < local_ab0)) || (lVar37 + local_ab0 <= lVar36))
      goto LAB_0010736e;
      lVar37 = ((long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)local_aa8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - local_ab0;
      uVar34 = lVar36 + lVar37;
      if ((long)uVar34 < 0) {
        uVar34 = (long)uVar34 >> 5;
LAB_00106d9c:
        pMVar27 = local_aa8.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                  lVar37 + uVar34 * -0x20 + lVar36;
      }
      else {
        if (0x1f < uVar34) {
          uVar34 = uVar34 >> 5;
          goto LAB_00106d9c;
        }
        pMVar27 = (Matrix<double,__1,_1,_0,__1,_1> *)
                  ((long)&local_aa8.
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur[-local_ab0].
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data + lVar39);
      }
      lVar37 = ((long)local_b88.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_b88.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
               ((long)local_b88.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_b88.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
               ((((ulong)((long)local_b88.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (long)local_b88.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(local_b88.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
               0x20;
      if (((lVar37 == 0) || (lVar36 < 0)) || (lVar37 <= lVar36)) goto LAB_0010736e;
      lVar37 = (long)local_b88.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur -
               (long)local_b88.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first >> 4;
      uVar34 = lVar36 + lVar37;
      if ((long)uVar34 < 0) {
        uVar34 = (long)uVar34 >> 5;
LAB_00106e4f:
        pMVar33 = local_b88.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                  lVar37 + uVar34 * -0x20 + lVar36;
      }
      else {
        if (0x1f < uVar34) {
          uVar34 = uVar34 >> 5;
          goto LAB_00106e4f;
        }
        pMVar33 = (Matrix<double,__1,_1,_0,__1,_1> *)
                  ((long)&((local_b88.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                          m_data + lVar39);
      }
      if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
          != (pMVar33->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows) {
LAB_00107636:
        pcVar30 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_001074a9;
      }
      lVar37 = (pMVar33->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows;
      local_b38.m_xpr.m_lhs = pMVar27;
      local_b38.m_xpr.m_rhs = pMVar33;
      if (lVar37 == 0) {
        SVar48 = 0.0;
      }
      else {
        if (lVar37 < 1) goto LAB_0010766a;
        local_a48.m_d.data =
             (plainobjectbase_evaluator_data<double,_0>)
             (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
        local_a40.m_d.data =
             (plainobjectbase_evaluator_data<double,_0>)
             (pMVar33->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
        SVar48 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                           ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                             *)local_a58,(scalar_sum_op<double,_double> *)&local_8c8,&local_b38);
      }
      lVar37 = ((long)local_8a8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_8a8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
               ((long)local_8a8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_8a8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
               ((((ulong)((long)local_8a8.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (long)local_8a8.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(local_8a8.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
               0x20;
      if (((lVar37 == 0) || (lVar36 < local_8b0)) || (lVar37 + local_8b0 <= lVar36))
      goto LAB_0010736e;
      lVar37 = ((long)local_8a8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)local_8a8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - local_8b0;
      uVar34 = lVar36 + lVar37;
      if ((long)uVar34 < 0) {
        uVar34 = (long)uVar34 >> 5;
LAB_00106f70:
        pMVar27 = local_8a8.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                  lVar37 + uVar34 * -0x20 + lVar36;
      }
      else {
        if (0x1f < uVar34) {
          uVar34 = uVar34 >> 5;
          goto LAB_00106f70;
        }
        pMVar27 = (Matrix<double,__1,_1,_0,__1,_1> *)
                  ((long)&local_8a8.
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur[-local_8b0].
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data + lVar39);
      }
      lVar37 = ((long)local_7f8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_7f8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
               ((long)local_7f8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_7f8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
               ((((ulong)((long)local_7f8.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (long)local_7f8.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(local_7f8.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
               0x20;
      if (((lVar37 == 0) || (lVar36 < local_800)) || (lVar37 + local_800 <= lVar36))
      goto LAB_0010736e;
      lVar37 = ((long)local_7f8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)local_7f8.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - local_800;
      uVar34 = lVar36 + lVar37;
      if ((long)uVar34 < 0) {
        uVar34 = (long)uVar34 >> 5;
LAB_00107038:
        pMVar33 = local_7f8.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                  lVar37 + uVar34 * -0x20 + lVar36;
      }
      else {
        if (0x1f < uVar34) {
          uVar34 = uVar34 >> 5;
          goto LAB_00107038;
        }
        pMVar33 = (Matrix<double,__1,_1,_0,__1,_1> *)
                  ((long)&local_7f8.
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur[-local_800].
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data + lVar39);
      }
      if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
          != (pMVar33->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows) goto LAB_00107636;
      lVar37 = (pMVar33->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows;
      local_b38.m_xpr.m_lhs = pMVar27;
      local_b38.m_xpr.m_rhs = pMVar33;
      if (lVar37 == 0) {
        uVar42 = 0;
        uVar44 = 0;
      }
      else {
        if (lVar37 < 1) {
LAB_0010766a:
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                       );
        }
        local_a48.m_d.data =
             (plainobjectbase_evaluator_data<double,_0>)
             (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
        local_a40.m_d.data =
             (plainobjectbase_evaluator_data<double,_0>)
             (pMVar33->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
        SVar19 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                           ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                             *)local_a58,(scalar_sum_op<double,_double> *)&local_8c8,&local_b38);
        uVar42 = SUB84(SVar19,0);
        uVar44 = (undefined4)((ulong)SVar19 >> 0x20);
      }
      auVar49._8_8_ = 0;
      auVar49._0_8_ = SVar48;
      auVar50 = sqrtpd(auVar49,auVar49);
      local_bb8 = local_bb8 + SQRT((double)CONCAT44(uVar44,uVar42)) + auVar50._0_8_;
      lVar36 = lVar36 + 1;
      lVar39 = lVar39 + 0x10;
      if (lVar36 == 24000) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Sum of error on the 10 last samples = ",0x26);
        poVar28 = std::ostream::_M_insert<double>(local_bb8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar28 + -0x18) + (char)poVar28);
        std::ostream::put((char)poVar28);
        std::ostream::flush();
        if (local_bb8 <= 0.07) {
          local_b94 = 0;
        }
LAB_00107295:
        std::
        deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::~deque((deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)(local_5d8 + 8));
        stateObservation::LipmDcmEstimator::~LipmDcmEstimator((LipmDcmEstimator *)local_578);
        std::
        deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::~deque(&local_8a8);
        std::
        deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::~deque(&local_aa8);
        std::
        deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::~deque(&local_928);
        std::
        deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::~deque(&local_850);
        std::
        deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::~deque(&dStack_980);
        if (local_768.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_768.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_750.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_750.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        std::
        deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::~deque(&local_a30);
        std::
        deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::~deque(&local_9d8);
        std::
        deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::~deque(&local_7f8);
        std::
        deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::~deque(&local_b00);
        std::
        deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::~deque(&local_b88);
        return local_b94;
      }
    } while( true );
  }
LAB_00107617:
  pcVar30 = 
  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 2, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 2, 1>]"
  ;
LAB_0010762c:
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,pcVar30);
}

Assistant:

int testDcmBiasEstimator(int errorCode)
{
  double w0 = sqrt(cst::gravityConstant / 0.9);
  double dt = 0.005;

  double biasDriftPerSecondStd = 0.005;
  double zmpMeasurementErrorStd = 0.001;
  double dcmMeasurementErrorStd = 0.005;

  int signallength = int(120. / dt);

  ///////////////////////////////////////
  /// Build the ground truth signals
  ///////////////////////////////////////
  typedef tools::ProbabilityLawSimulation ran;
  IndexedVectorArray dcm(signallength), localBias(signallength), bias(signallength), zmp(signallength),
      gamma(signallength);
  std::vector<double> yaw(signallength), kappa(signallength);

  /// set the desired exponential convergence of the DCM
  double lambda = 2;

  /// initialize the dcm and localBias to a random value
  dcm[0] = ran::getGaussianMatrix<Vector2>() * 4;
  double initBiasstd = 0.01;

  localBias[0] = ran::getGaussianMatrix<Vector2>() * 0.01;
  Vector2 deviation = ran::getGaussianMatrix<Vector2>() * 0.05;
  zmp[0] = (lambda / w0 + 1) * dcm[0] + deviation;

  for(int i = 0; i < signallength - 1; ++i)
  {
    gamma[i] = ran::getGaussianMatrix<Vector2>();
    kappa[i] = ran::getUniformScalar(0.5, 1.5);
    /// dcm dynamics
    dcm[i + 1] = dcm[i] + dt * w0 * (dcm[i] - kappa[i] * zmp[i] + gamma[i]);
    /// local bias drift
    localBias[i + 1] = localBias[i] + ran::getGaussianMatrix<Vector2>() * biasDriftPerSecondStd * dt;
    /// set a noisy zmp to create  bounded drift of the DCM
    deviation += ran::getGaussianMatrix<Vector2>() * 0.05;
    zmp[i + 1] = (1. / kappa[i]) * ((lambda / w0 + 1) * dcm[i] + gamma[i]) + ran::getGaussianMatrix<Vector2>() * 0.05
                 + deviation;
  }

  for(int i = 0; i < signallength; ++i)
  {
    /// global-frame bias computation
    yaw[i] = ran::getGaussianScalar(2 * M_PI);
    bias[i] = Rotation2D(yaw[i]) * localBias[i];
  }

  /////////////////////////////////
  /// Build the measurements
  /////////////////////////////////
  IndexedVectorArray dcm_m_unbiased(signallength), dcm_m(signallength), zmp_m(signallength);

  for(int i = 0; i < signallength; ++i)
  {

    dcm_m_unbiased[i] = dcm[i] + ran::getGaussianMatrix<Vector2>() * dcmMeasurementErrorStd;
    dcm_m[i] = dcm_m_unbiased[i] + bias[i];
    zmp_m[i] = zmp[i] + ran::getGaussianMatrix<Vector2>() * zmpMeasurementErrorStd;
  }

  /////////////////////////////////
  /// Run the estimator
  /////////////////////////////////
  IndexedVectorArray dcm_hat(signallength), bias_hat(signallength);

  Vector2 initbias{0.0, 0.0};

  LipmDcmEstimator est(dt, w0, biasDriftPerSecondStd, dcmMeasurementErrorStd, zmpMeasurementErrorStd);

  est.resetWithMeasurements(dcm_m[0], zmp_m[0], yaw[0], true, initbias, Vector2::Constant(initBiasstd));

  IndexedVectorArray log;

  for(int i = 1; i < signallength; i++)
  {
    est.setInputs(dcm_m[i], zmp_m[i], yaw[i], gamma[i - 1], kappa[i - 1]);
    est.update();
    bias_hat[i] = est.getBias();
    dcm_hat[i] = est.getUnbiasedDCM();

    /// NaN detection
    if(dcm_hat[i] != dcm_hat[i])
    {
      std::cout << "NaN detected = " << i << " " << dcm_hat[i].transpose() << std::endl;
      return errorCode;
    }

    Vector log_k(11);

    log_k << i, bias_hat[i], localBias[i], dcm_hat[i], dcm_m_unbiased[i], dcm[i];
    log.pushBack(log_k);
  }

  /// uncomment the following line to have a bit of a log
  // log.writeInFile("dcm.txt");

  /////////////////////////////////
  /// Check the error
  /////////////////////////////////
  double error = 0;

  for(int i = signallength - 10; i < signallength; ++i)
  {
    error += (dcm_hat[i] - dcm[i]).norm() + (bias_hat[i] - bias[i]).norm();
  }

  std::cout << "Sum of error on the 10 last samples = " << error << std::endl;

  if(error > 0.07)
  {
    return errorCode;
  }
  else
  {
    return 0;
  }
}